

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::EnhancedLayouts::Utils::ShaderInterface::GetDefinitionsOutputs_abi_cxx11_
          (string *__return_storage_ptr__,ShaderInterface *this)

{
  FLAVOUR in_ECX;
  
  GetDefinitions_abi_cxx11_
            (__return_storage_ptr__,(Utils *)&this->m_outputs,
             (PtrVector *)(ulong)((uint)(this->m_stage == TESS_CTRL) * 2),in_ECX);
  return __return_storage_ptr__;
}

Assistant:

Variable::FLAVOUR Variable::GetFlavour(Shader::STAGES stage, VARYING_DIRECTION direction)
{
	FLAVOUR result = BASIC;

	switch (stage)
	{
	case Shader::GEOMETRY:
	case Shader::TESS_EVAL:
		if (INPUT == direction)
		{
			result = ARRAY;
		}
		break;
	case Shader::TESS_CTRL:
		result = INDEXED_BY_INVOCATION_ID;
		break;
	default:
		break;
	}

	return result;
}